

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  DescriptorProto *this_local;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_006fb450;
  SharedDtor(this);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(&this->reserved_name_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::~RepeatedPtrField
            (&this->reserved_range_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::~RepeatedPtrField(&this->oneof_decl_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->extension_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
            (&this->extension_range_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField(&this->nested_type_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField(&this->field_);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena(&this->_internal_metadata_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto)
  SharedDtor();
}